

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O1

session_interface * __thiscall cppcms::http::context::session(context *this)

{
  _data *p_Var1;
  session_interface *this_00;
  
  p_Var1 = (this->d).ptr_;
  if ((p_Var1->session)._M_t.
      super___uniq_ptr_impl<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppcms::session_interface_*,_std::default_delete<cppcms::session_interface>_>
      .super__Head_base<0UL,_cppcms::session_interface_*,_false>._M_head_impl ==
      (session_interface *)0x0) {
    this_00 = (session_interface *)operator_new(0xc0);
    session_interface::session_interface(this_00,this);
    std::__uniq_ptr_impl<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>
    ::reset((__uniq_ptr_impl<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>
             *)&p_Var1->session,this_00);
  }
  return (((this->d).ptr_)->session)._M_t.
         super___uniq_ptr_impl<cppcms::session_interface,_std::default_delete<cppcms::session_interface>_>
         ._M_t.
         super__Tuple_impl<0UL,_cppcms::session_interface_*,_std::default_delete<cppcms::session_interface>_>
         .super__Head_base<0UL,_cppcms::session_interface_*,_false>._M_head_impl;
}

Assistant:

session_interface &context::session()
{
	if(!d->session.get())
		d->session.reset(new session_interface(*this));
	return *d->session;
}